

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node_instance.c
# Opt level: O1

apx_error_t
apx_nodeInstance_attach_to_file_manager(apx_nodeInstance_t *self,apx_fileManager_tag *file_manager)

{
  adt_error_t error_code;
  apx_error_t aVar1;
  apx_size_t size;
  apx_size_t aVar2;
  uint32_t uVar3;
  size_t sVar4;
  apx_file_t *paVar5;
  uint8_t *input;
  adt_str_t *self_00;
  char *name;
  apx_fileManager_tag *self_01;
  rmf_fileInfo_t *self_02;
  size_t len;
  char file_name [256];
  rmf_fileInfo_t local_190;
  apx_fileNotificationHandler_t local_148 [8];
  uint8_t local_48 [32];
  
  if (self == (apx_nodeInstance_t *)0x0) {
    return 1;
  }
  if (self->mode == '\x01') {
    if (self->provide_port_init_data != (uint8_t *)0x0) {
      self->provide_port_data_state = '\x02';
      uVar3 = self->provide_port_init_data_size;
      if (uVar3 == 0) {
        __assert_fail("(self != NULL) && (file_info != NULL) && (self->provide_port_init_data_size > 0u)"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/node_instance.c"
                      ,0x479,
                      "apx_error_t create_provide_port_data_file_info(apx_nodeInstance_t *, rmf_fileInfo_t *)"
                     );
      }
      strcpy((char *)local_148,self->name);
      sVar4 = strlen((char *)local_148);
      *(undefined4 *)((long)&local_148[0].arg + sVar4) = 0x74756f2e;
      *(undefined1 *)((long)&local_148[0].arg + sVar4 + 4) = 0;
      aVar1 = rmf_fileInfo_create(&local_190,0x7fffffff,uVar3,(char *)local_148,'\0','\0',
                                  (uint8_t *)0x0);
      if (aVar1 != 0) {
        return aVar1;
      }
      paVar5 = apx_fileManager_create_local_file(file_manager,&local_190);
      self->provide_port_data_file = paVar5;
      rmf_fileInfo_destroy(&local_190);
      if (self->provide_port_data_file == (apx_file_t *)0x0) {
        return 0x4a;
      }
      local_148[0].open_notify = apx_nodeInstance_vfile_open_notify;
      local_148[0].close_notify = apx_nodeInstance_vfile_close_notify;
      local_148[0].write_notify = apx_nodeInstance_vfile_write_notify;
      local_148[0].arg = self;
      apx_file_set_notification_handler(self->provide_port_data_file,local_148);
    }
    if (self->require_port_init_data != (uint8_t *)0x0) {
      self->require_port_data_state = '\x01';
    }
    if (self->node_data == (apx_nodeData_t *)0x0) {
      __assert_fail("self->node_data != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/node_instance.c"
                    ,0x46b,
                    "apx_error_t create_definition_file_info(apx_nodeInstance_t *, rmf_fileInfo_t *)"
                   );
    }
    size = apx_nodeData_definition_data_size(self->node_data);
    strcpy((char *)local_148,self->name);
    sVar4 = strlen((char *)local_148);
    *(undefined4 *)((long)&local_148[0].arg + sVar4) = 0x7870612e;
    *(undefined1 *)((long)&local_148[0].arg + sVar4 + 4) = 0;
    if (self->node_data == (apx_nodeData_t *)0x0) {
      input = (uint8_t *)0x0;
    }
    else {
      input = apx_nodeData_get_definition_data(self->node_data);
    }
    if (self->node_data == (apx_nodeData_t *)0x0) {
      len = 0;
    }
    else {
      aVar2 = apx_nodeData_definition_data_size(self->node_data);
      len = (size_t)aVar2;
    }
    sha256_calc(local_48,input,len);
    aVar1 = rmf_fileInfo_create(&local_190,0x7fffffff,size,(char *)local_148,'\0','\x02',local_48);
    if (aVar1 != 0) {
      return aVar1;
    }
    paVar5 = apx_fileManager_create_local_file(file_manager,&local_190);
    rmf_fileInfo_destroy(&local_190);
    if (paVar5 != (apx_file_t *)0x0) {
      local_148[0].open_notify = apx_nodeInstance_vfile_open_notify;
      local_148[0].close_notify = apx_nodeInstance_vfile_close_notify;
      local_148[0].write_notify = apx_nodeInstance_vfile_write_notify;
      local_148[0].arg = self;
      apx_file_set_notification_handler(paVar5,local_148);
      return 0;
    }
  }
  else {
    if (self->provide_port_init_data == (uint8_t *)0x0) {
      aVar1 = 0;
    }
    else {
      self->provide_port_data_state = '\x01';
      self_00 = adt_str_new_cstr(self->name);
      aVar1 = 0;
      if (self_00 != (adt_str_t *)0x0) {
        error_code = adt_str_append_cstr(self_00,".out");
        if (error_code == '\0') {
          name = adt_str_cstr(self_00);
          paVar5 = apx_fileManager_find_remote_file_by_name(file_manager,name);
          adt_str_delete(self_00);
          if (paVar5 != (apx_file_t *)0x0) {
            local_148[0].open_notify = apx_nodeInstance_vfile_open_notify;
            local_148[0].close_notify = apx_nodeInstance_vfile_close_notify;
            local_148[0].write_notify = apx_nodeInstance_vfile_write_notify;
            local_148[0].arg = self;
            apx_file_set_notification_handler(paVar5,local_148);
            self_01 = apx_file_get_file_manager(paVar5);
            if (self_01 == (apx_fileManager_tag *)0x0) {
              __assert_fail("file_manager != NULL",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/node_instance.c"
                            ,0x5ce,
                            "apx_error_t request_remote_provide_port_data(apx_nodeInstance_t *, apx_file_t *)"
                           );
            }
            self->provide_port_data_state = '\x03';
            apx_file_open(paVar5);
            uVar3 = apx_file_get_address_without_flags(paVar5);
            aVar1 = apx_fileManager_send_open_file_request(self_01,uVar3);
          }
        }
        else {
          aVar1 = convert_from_adt_to_apx_error(error_code);
        }
      }
      if (aVar1 != 0) {
        apx_fileManager_send_error_code(file_manager,aVar1);
      }
    }
    if (self->require_port_init_data == (uint8_t *)0x0) {
      return aVar1;
    }
    self->require_port_data_state = '\x02';
    uVar3 = self->require_port_init_data_size;
    if (uVar3 == 0) {
      __assert_fail("(self != NULL) && (file_info != NULL) && (self->require_port_init_data_size > 0u)"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/node_instance.c"
                    ,0x483,
                    "apx_error_t create_require_port_data_file_info(apx_nodeInstance_t *, rmf_fileInfo_t *)"
                   );
    }
    strcpy((char *)local_148,self->name);
    sVar4 = strlen((char *)local_148);
    *(undefined4 *)((long)&local_148[0].arg + sVar4) = 0x6e692e;
    aVar1 = rmf_fileInfo_create(&local_190,0x7fffffff,uVar3,(char *)local_148,'\0','\0',
                                (uint8_t *)0x0);
    if (aVar1 != 0) {
      return aVar1;
    }
    paVar5 = apx_fileManager_create_local_file(file_manager,&local_190);
    self->require_port_data_file = paVar5;
    rmf_fileInfo_destroy(&local_190);
    if (self->require_port_data_file != (apx_file_t *)0x0) {
      self_02 = apx_file_get_file_info(self->require_port_data_file);
      if ((self_02 != (rmf_fileInfo_t *)0x0) &&
         (uVar3 = rmf_fileInfo_address_without_flags(self_02), uVar3 != 0x7fffffff)) {
        set_file_notification_handler(self,self->require_port_data_file);
        aVar1 = apx_fileManager_publish_local_file(file_manager,self_02);
        return aVar1;
      }
      __assert_fail("(attached_file_info != NULL) && (rmf_fileInfo_address_without_flags(attached_file_info) != RMF_INVALID_ADDRESS)"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/node_instance.c"
                    ,0x5a1,
                    "apx_error_t apx_nodeInstance_attach_to_file_manager_server_mode(apx_nodeInstance_t *, struct apx_fileManager_tag *)"
                   );
    }
  }
  return 0x4a;
}

Assistant:

apx_error_t apx_nodeInstance_attach_to_file_manager(apx_nodeInstance_t* self, struct apx_fileManager_tag* file_manager)
{
   if (self != NULL)
   {
      if (self->mode == APX_CLIENT_MODE)
      {
         return apx_nodeInstance_attach_to_file_manager_client_mode(self, file_manager);
      }
      else
      {
         return apx_nodeInstance_attach_to_file_manager_server_mode(self, file_manager);
      }
   }
   return APX_INVALID_ARGUMENT_ERROR;
}